

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::PaddingLayerParams::SharedDtor(PaddingLayerParams *this)

{
  ulong uVar1;
  BorderAmounts *this_00;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6d89);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  if (this != (PaddingLayerParams *)_PaddingLayerParams_default_instance_) {
    this_00 = this->paddingamounts_;
    if (this_00 != (BorderAmounts *)0x0) {
      BorderAmounts::~BorderAmounts(this_00);
    }
    operator_delete(this_00,0x30);
  }
  if (this->_oneof_case_[0] != 0) {
    clear_PaddingType(this);
  }
  return;
}

Assistant:

inline void PaddingLayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete paddingamounts_;
  if (has_PaddingType()) {
    clear_PaddingType();
  }
}